

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# byte_string.hpp
# Opt level: O3

type jsoncons::detail::
     decode_base64_generic<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,bool(*)(char),std::__cxx11::string>
               (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                first,__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      last,uint8_t *reverse_alphabet,_func_bool_char *f,
               basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *result)

{
  undefined6 uVar1;
  undefined7 uVar2;
  bool bVar3;
  byte bVar4;
  undefined8 in_RAX;
  long lVar5;
  ulong uVar6;
  byte bVar7;
  byte bVar8;
  undefined8 uVar10;
  type tVar11;
  uint8_t a4 [4];
  uint8_t a3 [3];
  undefined8 uStack_38;
  ulong uVar9;
  
  if (first._M_current != last._M_current) {
    uVar6 = 0;
    uStack_38 = in_RAX;
    do {
      uVar9 = uVar6;
      if (*first._M_current == '=') break;
      bVar3 = (*f)(*first._M_current);
      uVar10 = uStack_38;
      if (!bVar3) {
        uVar10 = 1;
        goto LAB_0029491c;
      }
      bVar8 = (char)uVar6 + 1;
      uVar9 = (ulong)bVar8;
      *(char *)((long)&uStack_38 + uVar6 + 1) = *first._M_current;
      if (bVar8 == 4) {
        lVar5 = 0;
        do {
          *(uint8_t *)((long)&uStack_38 + lVar5 + 1) =
               reverse_alphabet[*(byte *)((long)&uStack_38 + lVar5 + 1)];
          lVar5 = lVar5 + 1;
        } while (lVar5 != 4);
        bVar8 = uStack_38._2_1_;
        bVar4 = uStack_38._1_1_ << 2;
        bVar7 = uStack_38._2_1_ >> 4;
        uStack_38._0_6_ = CONCAT15(bVar7 & 3 | bVar4,(undefined5)uStack_38);
        uVar1 = (undefined6)uStack_38;
        uStack_38._3_1_ = SUB81(uVar10,3);
        bVar4 = uStack_38._3_1_;
        uStack_38._0_7_ = CONCAT16(uStack_38._3_1_ >> 2 & 0xf | bVar8 << 4,uVar1);
        uVar2 = (undefined7)uStack_38;
        uStack_38._4_1_ = SUB81(uVar10,4);
        uStack_38 = CONCAT17(bVar4 * '@' + uStack_38._4_1_,uVar2);
        lVar5 = 0;
        do {
          std::__cxx11::string::push_back((char)result);
          lVar5 = lVar5 + 1;
        } while (lVar5 != 3);
        uVar9 = 0;
      }
      first._M_current = first._M_current + 1;
      uVar6 = uVar9;
    } while (first._M_current != last._M_current);
    uVar10 = uStack_38;
    if ((char)uVar9 != '\0') {
      uVar6 = 0;
      do {
        *(uint8_t *)((long)&uStack_38 + uVar6 + 1) =
             reverse_alphabet[*(byte *)((long)&uStack_38 + uVar6 + 1)];
        uVar6 = uVar6 + 1;
      } while (uVar9 != uVar6);
      bVar8 = uStack_38._2_1_;
      bVar4 = uStack_38._1_1_ << 2;
      bVar7 = uStack_38._2_1_ >> 4;
      uStack_38._0_6_ = CONCAT15(bVar7 & 3 | bVar4,(undefined5)uStack_38);
      uVar1 = (undefined6)uStack_38;
      uStack_38._3_1_ = SUB81(uVar10,3);
      uStack_38._7_1_ = SUB81(uVar10,7);
      uStack_38._0_7_ = CONCAT16(uStack_38._3_1_ >> 2 & 0xf | bVar8 << 4,uVar1);
      if ((int)uVar9 != 1) {
        uVar10 = 0;
        uVar6 = 0;
        do {
          std::__cxx11::string::push_back((char)result);
          uVar6 = uVar6 + 1;
          first._M_current = last._M_current;
        } while ((int)uVar9 - 1 != uVar6);
        goto LAB_0029491c;
      }
    }
  }
  uVar10 = 0;
  first._M_current = last._M_current;
LAB_0029491c:
  tVar11._8_8_ = uVar10;
  tVar11.it._M_current = first._M_current;
  return tVar11;
}

Assistant:

typename std::enable_if<ext_traits::is_back_insertable_byte_container<Container>::value,decode_result<InputIt>>::type 
    decode_base64_generic(InputIt first, InputIt last, 
                          const uint8_t reverse_alphabet[256],
                          F f,
                          Container& result)
    {
        uint8_t a4[4], a3[3];
        uint8_t i = 0;
        uint8_t j = 0;

        while (first != last && *first != '=')
        {
            if (!f(*first))
            {
                return decode_result<InputIt>{first, conv_errc::conversion_failed};
            }

            a4[i++] = static_cast<uint8_t>(*first++); 
            if (i == 4)
            {
                for (i = 0; i < 4; ++i) 
                {
                    a4[i] = reverse_alphabet[a4[i]];
                }

                a3[0] = (a4[0] << 2) + ((a4[1] & 0x30) >> 4);
                a3[1] = ((a4[1] & 0xf) << 4) + ((a4[2] & 0x3c) >> 2);
                a3[2] = ((a4[2] & 0x3) << 6) +   a4[3];

                for (i = 0; i < 3; i++) 
                {
                    result.push_back(a3[i]);
                }
                i = 0;
            }
        }

        if (i > 0)
        {
            for (j = 0; j < i; ++j) 
            {
                a4[j] = reverse_alphabet[a4[j]];
            }

            a3[0] = (a4[0] << 2) + ((a4[1] & 0x30) >> 4);
            a3[1] = ((a4[1] & 0xf) << 4) + ((a4[2] & 0x3c) >> 2);

            for (j = 0; j < i - 1; ++j) 
            {
                result.push_back(a3[j]);
            }
        }
        return decode_result<InputIt>{last, conv_errc::success};
    }